

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O3

int archive_format_gnutar_header(archive_write *a,char *h,archive_entry *entry,int tartype)

{
  undefined4 uVar1;
  void *pvVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  mode_t mVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  size_t sVar12;
  size_t sVar13;
  la_int64_t lVar14;
  ulong uVar15;
  dev_t dVar16;
  char *pcVar17;
  long lVar18;
  dev_t dVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  
  pvVar2 = a->format_data;
  memcpy(h,"",0x200);
  uVar20 = tartype - 0x4b;
  if (uVar20 < 2) {
    pcVar10 = archive_entry_pathname(entry);
    uVar11 = strlen(pcVar10);
  }
  else {
    pcVar10 = *(char **)((long)pvVar2 + 0x20);
    uVar11 = *(ulong *)((long)pvVar2 + 0x28);
  }
  if (99 < uVar11) {
    uVar11 = 100;
  }
  memcpy(h,pcVar10,uVar11);
  uVar11 = *(ulong *)((long)pvVar2 + 0x18);
  if (uVar11 != 0) {
    sVar12 = 100;
    if (uVar11 < 100) {
      sVar12 = uVar11;
    }
    memcpy(h + 0x9d,*(void **)((long)pvVar2 + 0x10),sVar12);
  }
  if (uVar20 < 2) {
    pcVar10 = archive_entry_uname(entry);
    uVar11 = strlen(pcVar10);
  }
  else {
    pcVar10 = *(char **)((long)pvVar2 + 0x30);
    uVar11 = *(ulong *)((long)pvVar2 + 0x38);
  }
  if (uVar11 != 0) {
    sVar12 = 0x20;
    if (uVar11 < 0x20) {
      sVar12 = uVar11;
    }
    memcpy(h + 0x109,pcVar10,sVar12);
  }
  if (uVar20 < 2) {
    pcVar10 = archive_entry_gname(entry);
    sVar12 = strlen(pcVar10);
  }
  else {
    pcVar10 = *(char **)((long)pvVar2 + 0x40);
    sVar12 = *(size_t *)((long)pvVar2 + 0x48);
  }
  if (sVar12 != 0) {
    sVar13 = strlen(pcVar10);
    if (0x20 < sVar13) {
      sVar12 = 0x20;
    }
    memcpy(h + 0x129,pcVar10,sVar12);
  }
  mVar7 = archive_entry_mode(entry);
  uVar20 = 8;
  uVar11 = (ulong)(mVar7 & 0xfff);
  pcVar10 = h + 0x6b;
  do {
    pcVar17 = pcVar10;
    uVar15 = uVar11;
    pcVar17[-1] = (byte)uVar15 & 7 | 0x30;
    uVar20 = uVar20 - 1;
    uVar11 = uVar15 >> 3;
    pcVar10 = pcVar17 + -1;
  } while (1 < uVar20);
  if (7 < uVar15) {
    builtin_strncpy(pcVar17 + -1,"7777777",7);
  }
  lVar14 = archive_entry_uid(entry);
  iVar8 = format_number(lVar14,h + 0x6c,7,8);
  if (iVar8 == 0) {
    iVar8 = 0;
  }
  else {
    lVar14 = archive_entry_uid(entry);
    archive_set_error(&a->archive,0x22,"Numeric user ID %jd too large",lVar14);
    iVar8 = -0x19;
  }
  lVar14 = archive_entry_gid(entry);
  iVar9 = format_number(lVar14,h + 0x74,7,8);
  if (iVar9 != 0) {
    lVar14 = archive_entry_gid(entry);
    archive_set_error(&a->archive,0x22,"Numeric group ID %jd too large",lVar14);
    iVar8 = -0x19;
  }
  lVar14 = archive_entry_size(entry);
  uVar20 = 0xc;
  iVar9 = format_number(lVar14,h + 0x7c,0xb,0xc);
  if (iVar9 != 0) {
    archive_set_error(&a->archive,0x22,"File size out of range");
    iVar8 = -0x19;
  }
  uVar15 = archive_entry_mtime(entry);
  uVar11 = 0;
  if (0 < (long)uVar15) {
    uVar11 = uVar15;
  }
  pcVar10 = h + 0x93;
  do {
    uVar15 = uVar11;
    pcVar17 = pcVar10;
    pcVar17[-1] = (byte)uVar15 & 7 | 0x30;
    uVar20 = uVar20 - 1;
    pcVar10 = pcVar17 + -1;
    uVar11 = uVar15 >> 3;
  } while (1 < uVar20);
  if (7 < uVar15) {
    builtin_strncpy(pcVar17 + -1,"77777777777",0xb);
  }
  mVar7 = archive_entry_filetype(entry);
  if (mVar7 != 0x6000) {
    mVar7 = archive_entry_filetype(entry);
    if (mVar7 != 0x2000) goto LAB_0063fc76;
  }
  dVar16 = archive_entry_rdevmajor(entry);
  dVar19 = 0;
  if (0 < (long)dVar16) {
    dVar19 = dVar16;
  }
  uVar20 = 7;
  pcVar10 = h + 0x14f;
  do {
    uVar11 = dVar19;
    pcVar17 = pcVar10;
    pcVar17[-1] = (byte)uVar11 & 7 | 0x30;
    uVar20 = uVar20 - 1;
    pcVar10 = pcVar17 + -1;
    dVar19 = uVar11 >> 3;
  } while (1 < uVar20);
  if (7 < uVar11) {
    builtin_strncpy(pcVar17 + -1,"777777",6);
    archive_set_error(&a->archive,0x22,"Major device number too large");
    iVar8 = -0x19;
  }
  dVar16 = archive_entry_rdevminor(entry);
  dVar19 = 0;
  if (0 < (long)dVar16) {
    dVar19 = dVar16;
  }
  uVar20 = 7;
  pcVar10 = h + 0x157;
  do {
    uVar11 = dVar19;
    pcVar17 = pcVar10;
    pcVar17[-1] = (byte)uVar11 & 7 | 0x30;
    uVar20 = uVar20 - 1;
    pcVar10 = pcVar17 + -1;
    dVar19 = uVar11 >> 3;
  } while (1 < uVar20);
  if (7 < uVar11) {
    builtin_strncpy(pcVar17 + -1,"777777",6);
    archive_set_error(&a->archive,0x22,"Minor device number too large");
    iVar8 = -0x19;
  }
LAB_0063fc76:
  h[0x9c] = (char)tartype;
  lVar18 = 0;
  iVar9 = 0;
  iVar21 = 0;
  iVar22 = 0;
  iVar23 = 0;
  do {
    uVar1 = *(undefined4 *)(h + lVar18);
    uVar11 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar11;
    auVar3[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar4[8] = (char)((uint)uVar1 >> 0x10);
    auVar4._0_8_ = uVar11;
    auVar4[9] = 0;
    auVar4._10_3_ = auVar3._10_3_;
    auVar6._5_8_ = 0;
    auVar6._0_5_ = auVar4._8_5_;
    auVar5[4] = (char)((uint)uVar1 >> 8);
    auVar5._0_4_ = (int)uVar11;
    auVar5[5] = 0;
    auVar5._6_7_ = SUB137(auVar6 << 0x40,6);
    iVar9 = iVar9 + (int)uVar11;
    iVar21 = iVar21 + auVar5._4_4_;
    iVar22 = iVar22 + auVar4._8_4_;
    iVar23 = iVar23 + (uint)(uint3)(auVar3._10_3_ >> 0x10);
    lVar18 = lVar18 + 4;
  } while (lVar18 != 0x200);
  h[0x9a] = '\0';
  uVar20 = 7;
  uVar11 = (ulong)(uint)(iVar23 + iVar21 + iVar22 + iVar9);
  pcVar10 = h + 0x9a;
  do {
    pcVar17 = pcVar10;
    uVar15 = uVar11;
    pcVar17[-1] = (byte)uVar15 & 7 | 0x30;
    uVar20 = uVar20 - 1;
    uVar11 = uVar15 >> 3;
    pcVar10 = pcVar17 + -1;
  } while (1 < uVar20);
  if (7 < uVar15) {
    builtin_strncpy(pcVar17 + -1,"777777",6);
  }
  return iVar8;
}

Assistant:

static int
archive_format_gnutar_header(struct archive_write *a, char h[512],
    struct archive_entry *entry, int tartype)
{
	unsigned int checksum;
	int i, ret;
	size_t copy_length;
	const char *p;
	struct gnutar *gnutar;

	gnutar = (struct gnutar *)a->format_data;

	ret = 0;

	/*
	 * The "template header" already includes the signature,
	 * various end-of-field markers, and other required elements.
	 */
	memcpy(h, &template_header, 512);

	/*
	 * Because the block is already null-filled, and strings
	 * are allowed to exactly fill their destination (without null),
	 * I use memcpy(dest, src, strlen()) here a lot to copy strings.
	 */

	if (tartype == 'K' || tartype == 'L') {
		p = archive_entry_pathname(entry);
		copy_length = strlen(p);
	} else {
		p = gnutar->pathname;
		copy_length = gnutar->pathname_length;
	}
	if (copy_length > GNUTAR_name_size)
		copy_length = GNUTAR_name_size;
	memcpy(h + GNUTAR_name_offset, p, copy_length);

	if ((copy_length = gnutar->linkname_length) > 0) {
		if (copy_length > GNUTAR_linkname_size)
			copy_length = GNUTAR_linkname_size;
		memcpy(h + GNUTAR_linkname_offset, gnutar->linkname,
		    copy_length);
	}

	/* TODO: How does GNU tar handle unames longer than GNUTAR_uname_size? */
	if (tartype == 'K' || tartype == 'L') {
		p = archive_entry_uname(entry);
		copy_length = strlen(p);
	} else {
		p = gnutar->uname;
		copy_length = gnutar->uname_length;
	}
	if (copy_length > 0) {
		if (copy_length > GNUTAR_uname_size)
			copy_length = GNUTAR_uname_size;
		memcpy(h + GNUTAR_uname_offset, p, copy_length);
	}

	/* TODO: How does GNU tar handle gnames longer than GNUTAR_gname_size? */
	if (tartype == 'K' || tartype == 'L') {
		p = archive_entry_gname(entry);
		copy_length = strlen(p);
	} else {
		p = gnutar->gname;
		copy_length = gnutar->gname_length;
	}
	if (copy_length > 0) {
		if (strlen(p) > GNUTAR_gname_size)
			copy_length = GNUTAR_gname_size;
		memcpy(h + GNUTAR_gname_offset, p, copy_length);
	}

	/* By truncating the mode here, we ensure it always fits. */
	format_octal(archive_entry_mode(entry) & 07777,
	    h + GNUTAR_mode_offset, GNUTAR_mode_size);

	/* GNU tar supports base-256 here, so should never overflow. */
	if (format_number(archive_entry_uid(entry), h + GNUTAR_uid_offset,
		GNUTAR_uid_size, GNUTAR_uid_max_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric user ID %jd too large",
		    (intmax_t)archive_entry_uid(entry));
		ret = ARCHIVE_FAILED;
	}

	/* GNU tar supports base-256 here, so should never overflow. */
	if (format_number(archive_entry_gid(entry), h + GNUTAR_gid_offset,
		GNUTAR_gid_size, GNUTAR_gid_max_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric group ID %jd too large",
		    (intmax_t)archive_entry_gid(entry));
		ret = ARCHIVE_FAILED;
	}

	/* GNU tar supports base-256 here, so should never overflow. */
	if (format_number(archive_entry_size(entry), h + GNUTAR_size_offset,
		GNUTAR_size_size, GNUTAR_size_max_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File size out of range");
		ret = ARCHIVE_FAILED;
	}

	/* Shouldn't overflow before 2106, since mtime field is 33 bits. */
	format_octal(archive_entry_mtime(entry),
	    h + GNUTAR_mtime_offset, GNUTAR_mtime_size);

	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR) {
		if (format_octal(archive_entry_rdevmajor(entry),
		    h + GNUTAR_rdevmajor_offset,
			GNUTAR_rdevmajor_size)) {
			archive_set_error(&a->archive, ERANGE,
			    "Major device number too large");
			ret = ARCHIVE_FAILED;
		}

		if (format_octal(archive_entry_rdevminor(entry),
		    h + GNUTAR_rdevminor_offset,
			GNUTAR_rdevminor_size)) {
			archive_set_error(&a->archive, ERANGE,
			    "Minor device number too large");
			ret = ARCHIVE_FAILED;
		}
	}

	h[GNUTAR_typeflag_offset] = tartype;

	checksum = 0;
	for (i = 0; i < 512; i++)
		checksum += 255 & (unsigned int)h[i];
	h[GNUTAR_checksum_offset + 6] = '\0'; /* Can't be pre-set in the template. */
	/* h[GNUTAR_checksum_offset + 7] = ' '; */ /* This is pre-set in the template. */
	format_octal(checksum, h + GNUTAR_checksum_offset, 6);
	return (ret);
}